

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void mbedtls_md5_process(mbedtls_md5_context *ctx,uchar *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  uint32_t X [16];
  uchar *data_local;
  mbedtls_md5_context *ctx_local;
  
  iVar1 = *(int *)data;
  iVar2 = *(int *)(data + 4);
  iVar3 = *(int *)(data + 8);
  iVar4 = *(int *)(data + 0xc);
  iVar5 = *(int *)(data + 0x10);
  iVar6 = *(int *)(data + 0x14);
  iVar7 = *(int *)(data + 0x18);
  iVar8 = *(int *)(data + 0x1c);
  iVar9 = *(int *)(data + 0x20);
  iVar10 = *(int *)(data + 0x24);
  iVar11 = *(int *)(data + 0x28);
  iVar12 = *(int *)(data + 0x2c);
  iVar13 = *(int *)(data + 0x30);
  iVar14 = *(int *)(data + 0x34);
  iVar15 = *(int *)(data + 0x38);
  iVar16 = *(int *)(data + 0x3c);
  uVar20 = ctx->state[1];
  uVar19 = ctx->state[2];
  uVar18 = ctx->state[3];
  uVar17 = (uVar18 ^ uVar20 & (uVar19 ^ uVar18)) + iVar1 + -0x28955b88 + ctx->state[0];
  uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar20;
  uVar18 = (uVar19 ^ uVar17 & (uVar20 ^ uVar19)) + iVar2 + -0x173848aa + uVar18;
  uVar18 = (uVar18 * 0x1000 | uVar18 >> 0x14) + uVar17;
  uVar19 = (uVar20 ^ uVar18 & (uVar17 ^ uVar20)) + iVar3 + 0x242070db + uVar19;
  uVar19 = (uVar19 * 0x20000 | uVar19 >> 0xf) + uVar18;
  uVar20 = (uVar17 ^ uVar19 & (uVar18 ^ uVar17)) + iVar4 + -0x3e423112 + uVar20;
  uVar20 = (uVar20 * 0x400000 | uVar20 >> 10) + uVar19;
  uVar17 = (uVar18 ^ uVar20 & (uVar19 ^ uVar18)) + iVar5 + -0xa83f051 + uVar17;
  uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar20;
  uVar18 = (uVar19 ^ uVar17 & (uVar20 ^ uVar19)) + iVar6 + 0x4787c62a + uVar18;
  uVar18 = (uVar18 * 0x1000 | uVar18 >> 0x14) + uVar17;
  uVar19 = (uVar20 ^ uVar18 & (uVar17 ^ uVar20)) + iVar7 + -0x57cfb9ed + uVar19;
  uVar19 = (uVar19 * 0x20000 | uVar19 >> 0xf) + uVar18;
  uVar20 = (uVar17 ^ uVar19 & (uVar18 ^ uVar17)) + iVar8 + -0x2b96aff + uVar20;
  uVar20 = (uVar20 * 0x400000 | uVar20 >> 10) + uVar19;
  uVar17 = (uVar18 ^ uVar20 & (uVar19 ^ uVar18)) + iVar9 + 0x698098d8 + uVar17;
  uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar20;
  uVar18 = (uVar19 ^ uVar17 & (uVar20 ^ uVar19)) + iVar10 + -0x74bb0851 + uVar18;
  uVar18 = (uVar18 * 0x1000 | uVar18 >> 0x14) + uVar17;
  uVar19 = (uVar20 ^ uVar18 & (uVar17 ^ uVar20)) + iVar11 + -0xa44f + uVar19;
  uVar19 = (uVar19 * 0x20000 | uVar19 >> 0xf) + uVar18;
  uVar20 = (uVar17 ^ uVar19 & (uVar18 ^ uVar17)) + iVar12 + -0x76a32842 + uVar20;
  uVar20 = (uVar20 * 0x400000 | uVar20 >> 10) + uVar19;
  uVar17 = (uVar18 ^ uVar20 & (uVar19 ^ uVar18)) + iVar13 + 0x6b901122 + uVar17;
  uVar17 = (uVar17 * 0x80 | uVar17 >> 0x19) + uVar20;
  uVar18 = (uVar19 ^ uVar17 & (uVar20 ^ uVar19)) + iVar14 + -0x2678e6d + uVar18;
  uVar18 = (uVar18 * 0x1000 | uVar18 >> 0x14) + uVar17;
  uVar19 = (uVar20 ^ uVar18 & (uVar17 ^ uVar20)) + iVar15 + -0x5986bc72 + uVar19;
  uVar19 = (uVar19 * 0x20000 | uVar19 >> 0xf) + uVar18;
  uVar20 = (uVar17 ^ uVar19 & (uVar18 ^ uVar17)) + iVar16 + 0x49b40821 + uVar20;
  uVar20 = (uVar20 * 0x400000 | uVar20 >> 10) + uVar19;
  uVar17 = (uVar19 ^ uVar18 & (uVar20 ^ uVar19)) + iVar2 + -0x9e1da9e + uVar17;
  uVar17 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar20;
  uVar18 = (uVar20 ^ uVar19 & (uVar17 ^ uVar20)) + iVar7 + -0x3fbf4cc0 + uVar18;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar17;
  uVar19 = (uVar17 ^ uVar20 & (uVar18 ^ uVar17)) + iVar12 + 0x265e5a51 + uVar19;
  uVar19 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar18;
  uVar20 = (uVar18 ^ uVar17 & (uVar19 ^ uVar18)) + iVar1 + -0x16493856 + uVar20;
  uVar20 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar19;
  uVar17 = (uVar19 ^ uVar18 & (uVar20 ^ uVar19)) + iVar6 + -0x29d0efa3 + uVar17;
  uVar17 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar20;
  uVar18 = (uVar20 ^ uVar19 & (uVar17 ^ uVar20)) + iVar11 + 0x2441453 + uVar18;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar17;
  uVar19 = (uVar17 ^ uVar20 & (uVar18 ^ uVar17)) + iVar16 + -0x275e197f + uVar19;
  uVar19 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar18;
  uVar20 = (uVar18 ^ uVar17 & (uVar19 ^ uVar18)) + iVar5 + -0x182c0438 + uVar20;
  uVar20 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar19;
  uVar17 = (uVar19 ^ uVar18 & (uVar20 ^ uVar19)) + iVar10 + 0x21e1cde6 + uVar17;
  uVar17 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar20;
  uVar18 = (uVar20 ^ uVar19 & (uVar17 ^ uVar20)) + iVar15 + -0x3cc8f82a + uVar18;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar17;
  uVar19 = (uVar17 ^ uVar20 & (uVar18 ^ uVar17)) + iVar4 + -0xb2af279 + uVar19;
  uVar19 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar18;
  uVar20 = (uVar18 ^ uVar17 & (uVar19 ^ uVar18)) + iVar9 + 0x455a14ed + uVar20;
  uVar20 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar19;
  uVar17 = (uVar19 ^ uVar18 & (uVar20 ^ uVar19)) + iVar14 + -0x561c16fb + uVar17;
  uVar17 = (uVar17 * 0x20 | uVar17 >> 0x1b) + uVar20;
  uVar18 = (uVar20 ^ uVar19 & (uVar17 ^ uVar20)) + iVar3 + -0x3105c08 + uVar18;
  uVar18 = (uVar18 * 0x200 | uVar18 >> 0x17) + uVar17;
  uVar19 = (uVar17 ^ uVar20 & (uVar18 ^ uVar17)) + iVar8 + 0x676f02d9 + uVar19;
  uVar19 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar18;
  uVar20 = (uVar18 ^ uVar17 & (uVar19 ^ uVar18)) + iVar13 + -0x72d5b376 + uVar20;
  uVar20 = (uVar20 * 0x100000 | uVar20 >> 0xc) + uVar19;
  uVar17 = (uVar20 ^ uVar19 ^ uVar18) + iVar6 + -0x5c6be + uVar17;
  uVar17 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar20;
  uVar18 = (uVar17 ^ uVar20 ^ uVar19) + iVar9 + -0x788e097f + uVar18;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar17;
  uVar19 = (uVar18 ^ uVar17 ^ uVar20) + iVar12 + 0x6d9d6122 + uVar19;
  uVar19 = (uVar19 * 0x10000 | uVar19 >> 0x10) + uVar18;
  uVar20 = (uVar19 ^ uVar18 ^ uVar17) + iVar15 + -0x21ac7f4 + uVar20;
  uVar20 = (uVar20 * 0x800000 | uVar20 >> 9) + uVar19;
  uVar17 = (uVar20 ^ uVar19 ^ uVar18) + iVar2 + -0x5b4115bc + uVar17;
  uVar17 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar20;
  uVar18 = (uVar17 ^ uVar20 ^ uVar19) + iVar5 + 0x4bdecfa9 + uVar18;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar17;
  uVar19 = (uVar18 ^ uVar17 ^ uVar20) + iVar8 + -0x944b4a0 + uVar19;
  uVar19 = (uVar19 * 0x10000 | uVar19 >> 0x10) + uVar18;
  uVar20 = (uVar19 ^ uVar18 ^ uVar17) + iVar11 + -0x41404390 + uVar20;
  uVar20 = (uVar20 * 0x800000 | uVar20 >> 9) + uVar19;
  uVar17 = (uVar20 ^ uVar19 ^ uVar18) + iVar14 + 0x289b7ec6 + uVar17;
  uVar17 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar20;
  uVar18 = (uVar17 ^ uVar20 ^ uVar19) + iVar1 + -0x155ed806 + uVar18;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar17;
  uVar19 = (uVar18 ^ uVar17 ^ uVar20) + iVar4 + -0x2b10cf7b + uVar19;
  uVar19 = (uVar19 * 0x10000 | uVar19 >> 0x10) + uVar18;
  uVar20 = (uVar19 ^ uVar18 ^ uVar17) + iVar7 + 0x4881d05 + uVar20;
  uVar20 = (uVar20 * 0x800000 | uVar20 >> 9) + uVar19;
  uVar17 = (uVar20 ^ uVar19 ^ uVar18) + iVar10 + -0x262b2fc7 + uVar17;
  uVar17 = (uVar17 * 0x10 | uVar17 >> 0x1c) + uVar20;
  uVar18 = (uVar17 ^ uVar20 ^ uVar19) + iVar13 + -0x1924661b + uVar18;
  uVar18 = (uVar18 * 0x800 | uVar18 >> 0x15) + uVar17;
  uVar19 = (uVar18 ^ uVar17 ^ uVar20) + iVar16 + 0x1fa27cf8 + uVar19;
  uVar19 = (uVar19 * 0x10000 | uVar19 >> 0x10) + uVar18;
  uVar20 = (uVar19 ^ uVar18 ^ uVar17) + iVar3 + -0x3b53a99b + uVar20;
  uVar20 = (uVar20 * 0x800000 | uVar20 >> 9) + uVar19;
  uVar17 = (uVar19 ^ (uVar20 | uVar18 ^ 0xffffffff)) + iVar1 + -0xbd6ddbc + uVar17;
  uVar17 = (uVar17 * 0x40 | uVar17 >> 0x1a) + uVar20;
  uVar18 = (uVar20 ^ (uVar17 | uVar19 ^ 0xffffffff)) + iVar8 + 0x432aff97 + uVar18;
  uVar18 = (uVar18 * 0x400 | uVar18 >> 0x16) + uVar17;
  uVar19 = (uVar17 ^ (uVar18 | uVar20 ^ 0xffffffff)) + iVar15 + -0x546bdc59 + uVar19;
  uVar19 = (uVar19 * 0x8000 | uVar19 >> 0x11) + uVar18;
  uVar20 = (uVar18 ^ (uVar19 | uVar17 ^ 0xffffffff)) + iVar6 + -0x36c5fc7 + uVar20;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar19;
  uVar17 = (uVar19 ^ (uVar20 | uVar18 ^ 0xffffffff)) + iVar13 + 0x655b59c3 + uVar17;
  uVar17 = (uVar17 * 0x40 | uVar17 >> 0x1a) + uVar20;
  uVar18 = (uVar20 ^ (uVar17 | uVar19 ^ 0xffffffff)) + iVar4 + -0x70f3336e + uVar18;
  uVar18 = (uVar18 * 0x400 | uVar18 >> 0x16) + uVar17;
  uVar19 = (uVar17 ^ (uVar18 | uVar20 ^ 0xffffffff)) + iVar11 + -0x100b83 + uVar19;
  uVar19 = (uVar19 * 0x8000 | uVar19 >> 0x11) + uVar18;
  uVar20 = (uVar18 ^ (uVar19 | uVar17 ^ 0xffffffff)) + iVar2 + -0x7a7ba22f + uVar20;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar19;
  uVar17 = (uVar19 ^ (uVar20 | uVar18 ^ 0xffffffff)) + iVar9 + 0x6fa87e4f + uVar17;
  uVar17 = (uVar17 * 0x40 | uVar17 >> 0x1a) + uVar20;
  uVar18 = (uVar20 ^ (uVar17 | uVar19 ^ 0xffffffff)) + iVar16 + -0x1d31920 + uVar18;
  uVar18 = (uVar18 * 0x400 | uVar18 >> 0x16) + uVar17;
  uVar19 = (uVar17 ^ (uVar18 | uVar20 ^ 0xffffffff)) + iVar7 + -0x5cfebcec + uVar19;
  uVar21 = (uVar19 * 0x8000 | uVar19 >> 0x11) + uVar18;
  uVar20 = (uVar18 ^ (uVar21 | uVar17 ^ 0xffffffff)) + iVar14 + 0x4e0811a1 + uVar20;
  uVar22 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar17 = (uVar21 ^ (uVar22 | uVar18 ^ 0xffffffff)) + iVar5 + -0x8ac817e + uVar17;
  uVar20 = (uVar17 * 0x40 | uVar17 >> 0x1a) + uVar22;
  uVar18 = (uVar22 ^ (uVar20 | uVar21 ^ 0xffffffff)) + iVar12 + -0x42c50dcb + uVar18;
  uVar19 = (uVar18 * 0x400 | uVar18 >> 0x16) + uVar20;
  uVar21 = (uVar20 ^ (uVar19 | uVar22 ^ 0xffffffff)) + iVar3 + 0x2ad7d2bb + uVar21;
  uVar18 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar19;
  uVar22 = (uVar19 ^ (uVar18 | uVar20 ^ 0xffffffff)) + iVar10 + -0x14792c6f + uVar22;
  ctx->state[0] = uVar20 + ctx->state[0];
  ctx->state[1] = (uVar22 * 0x200000 | uVar22 >> 0xb) + uVar18 + ctx->state[1];
  ctx->state[2] = uVar18 + ctx->state[2];
  ctx->state[3] = uVar19 + ctx->state[3];
  return;
}

Assistant:

void mbedtls_md5_process( mbedtls_md5_context *ctx, const unsigned char data[64] )
{
    uint32_t X[16], A, B, C, D;

    GET_UINT32_LE( X[ 0], data,  0 );
    GET_UINT32_LE( X[ 1], data,  4 );
    GET_UINT32_LE( X[ 2], data,  8 );
    GET_UINT32_LE( X[ 3], data, 12 );
    GET_UINT32_LE( X[ 4], data, 16 );
    GET_UINT32_LE( X[ 5], data, 20 );
    GET_UINT32_LE( X[ 6], data, 24 );
    GET_UINT32_LE( X[ 7], data, 28 );
    GET_UINT32_LE( X[ 8], data, 32 );
    GET_UINT32_LE( X[ 9], data, 36 );
    GET_UINT32_LE( X[10], data, 40 );
    GET_UINT32_LE( X[11], data, 44 );
    GET_UINT32_LE( X[12], data, 48 );
    GET_UINT32_LE( X[13], data, 52 );
    GET_UINT32_LE( X[14], data, 56 );
    GET_UINT32_LE( X[15], data, 60 );

#define S(x,n) ((x << n) | ((x & 0xFFFFFFFF) >> (32 - n)))

#define P(a,b,c,d,k,s,t)                                \
{                                                       \
    a += F(b,c,d) + X[k] + t; a = S(a,s) + b;           \
}

    A = ctx->state[0];
    B = ctx->state[1];
    C = ctx->state[2];
    D = ctx->state[3];

#define F(x,y,z) (z ^ (x & (y ^ z)))

    P( A, B, C, D,  0,  7, 0xD76AA478 );
    P( D, A, B, C,  1, 12, 0xE8C7B756 );
    P( C, D, A, B,  2, 17, 0x242070DB );
    P( B, C, D, A,  3, 22, 0xC1BDCEEE );
    P( A, B, C, D,  4,  7, 0xF57C0FAF );
    P( D, A, B, C,  5, 12, 0x4787C62A );
    P( C, D, A, B,  6, 17, 0xA8304613 );
    P( B, C, D, A,  7, 22, 0xFD469501 );
    P( A, B, C, D,  8,  7, 0x698098D8 );
    P( D, A, B, C,  9, 12, 0x8B44F7AF );
    P( C, D, A, B, 10, 17, 0xFFFF5BB1 );
    P( B, C, D, A, 11, 22, 0x895CD7BE );
    P( A, B, C, D, 12,  7, 0x6B901122 );
    P( D, A, B, C, 13, 12, 0xFD987193 );
    P( C, D, A, B, 14, 17, 0xA679438E );
    P( B, C, D, A, 15, 22, 0x49B40821 );

#undef F

#define F(x,y,z) (y ^ (z & (x ^ y)))

    P( A, B, C, D,  1,  5, 0xF61E2562 );
    P( D, A, B, C,  6,  9, 0xC040B340 );
    P( C, D, A, B, 11, 14, 0x265E5A51 );
    P( B, C, D, A,  0, 20, 0xE9B6C7AA );
    P( A, B, C, D,  5,  5, 0xD62F105D );
    P( D, A, B, C, 10,  9, 0x02441453 );
    P( C, D, A, B, 15, 14, 0xD8A1E681 );
    P( B, C, D, A,  4, 20, 0xE7D3FBC8 );
    P( A, B, C, D,  9,  5, 0x21E1CDE6 );
    P( D, A, B, C, 14,  9, 0xC33707D6 );
    P( C, D, A, B,  3, 14, 0xF4D50D87 );
    P( B, C, D, A,  8, 20, 0x455A14ED );
    P( A, B, C, D, 13,  5, 0xA9E3E905 );
    P( D, A, B, C,  2,  9, 0xFCEFA3F8 );
    P( C, D, A, B,  7, 14, 0x676F02D9 );
    P( B, C, D, A, 12, 20, 0x8D2A4C8A );

#undef F

#define F(x,y,z) (x ^ y ^ z)

    P( A, B, C, D,  5,  4, 0xFFFA3942 );
    P( D, A, B, C,  8, 11, 0x8771F681 );
    P( C, D, A, B, 11, 16, 0x6D9D6122 );
    P( B, C, D, A, 14, 23, 0xFDE5380C );
    P( A, B, C, D,  1,  4, 0xA4BEEA44 );
    P( D, A, B, C,  4, 11, 0x4BDECFA9 );
    P( C, D, A, B,  7, 16, 0xF6BB4B60 );
    P( B, C, D, A, 10, 23, 0xBEBFBC70 );
    P( A, B, C, D, 13,  4, 0x289B7EC6 );
    P( D, A, B, C,  0, 11, 0xEAA127FA );
    P( C, D, A, B,  3, 16, 0xD4EF3085 );
    P( B, C, D, A,  6, 23, 0x04881D05 );
    P( A, B, C, D,  9,  4, 0xD9D4D039 );
    P( D, A, B, C, 12, 11, 0xE6DB99E5 );
    P( C, D, A, B, 15, 16, 0x1FA27CF8 );
    P( B, C, D, A,  2, 23, 0xC4AC5665 );

#undef F

#define F(x,y,z) (y ^ (x | ~z))

    P( A, B, C, D,  0,  6, 0xF4292244 );
    P( D, A, B, C,  7, 10, 0x432AFF97 );
    P( C, D, A, B, 14, 15, 0xAB9423A7 );
    P( B, C, D, A,  5, 21, 0xFC93A039 );
    P( A, B, C, D, 12,  6, 0x655B59C3 );
    P( D, A, B, C,  3, 10, 0x8F0CCC92 );
    P( C, D, A, B, 10, 15, 0xFFEFF47D );
    P( B, C, D, A,  1, 21, 0x85845DD1 );
    P( A, B, C, D,  8,  6, 0x6FA87E4F );
    P( D, A, B, C, 15, 10, 0xFE2CE6E0 );
    P( C, D, A, B,  6, 15, 0xA3014314 );
    P( B, C, D, A, 13, 21, 0x4E0811A1 );
    P( A, B, C, D,  4,  6, 0xF7537E82 );
    P( D, A, B, C, 11, 10, 0xBD3AF235 );
    P( C, D, A, B,  2, 15, 0x2AD7D2BB );
    P( B, C, D, A,  9, 21, 0xEB86D391 );

#undef F

    ctx->state[0] += A;
    ctx->state[1] += B;
    ctx->state[2] += C;
    ctx->state[3] += D;
}